

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_dictionary.hpp
# Opt level: O1

bool pd::prepareData(string *dir_name,string *data_filename,string *dict_filename,
                    uint32_t num_dimensions)

{
  uint __val;
  pointer pcVar1;
  char cVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  error_code *peVar6;
  ostream *poVar7;
  istream *piVar8;
  iterator iVar9;
  mapped_type *pmVar10;
  _Base_ptr p_Var11;
  basic_ostream<char,_std::char_traits<char>_> *pbVar12;
  uint uVar13;
  _Base_ptr p_Var14;
  uint uVar15;
  long local_560;
  ofstream of;
  ios_base local_468 [264];
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_360;
  ifstream fi;
  dir_itr_imp local_350 [16];
  uint auStack_340 [122];
  undefined1 local_158 [8];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  dict;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  result;
  path targetDir;
  long local_c8;
  undefined1 local_c0 [16];
  undefined1 local_b0 [8];
  string line;
  directory_iterator local_88;
  directory_iterator it;
  directory_iterator eod;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_70;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_68;
  undefined1 local_60 [8];
  uint32_t key;
  undefined4 uStack_54;
  char local_50 [16];
  directory_iterator local_40;
  uint32_t local_34;
  
  local_158 = (undefined1  [8])&dict._M_h._M_rehash_policy._M_next_resize;
  dict._M_h._M_buckets = (__buckets_ptr)0x1;
  dict._M_h._M_bucket_count = 0;
  dict._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  dict._M_h._M_element_count._0_4_ = 0x3f800000;
  dict._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  dict._M_h._M_rehash_policy._4_4_ = 0;
  dict._M_h._M_rehash_policy._M_next_resize = 0;
  local_34 = num_dimensions;
  bVar3 = readDictionary(dict_filename,
                         (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          *)local_158);
  if (bVar3) {
    result._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)&targetDir.m_pathname._M_string_length;
    pcVar1 = (dir_name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&result._M_t._M_impl.super__Rb_tree_header._M_node_count,pcVar1,
               pcVar1 + dir_name->_M_string_length);
    boost::filesystem::directory_iterator::directory_iterator
              (&local_88,(path *)&result._M_t._M_impl.super__Rb_tree_header._M_node_count,none);
    it.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)(dir_itr_imp *)0x0;
    std::ofstream::ofstream(&local_560,(string *)data_filename,_S_out);
    local_360 = local_88.m_imp.px;
    if (local_88.m_imp.px != (dir_itr_imp *)0x0) {
      LOCK();
      *(int *)local_88.m_imp.px = *(int *)local_88.m_imp.px + 1;
      UNLOCK();
    }
    _fi = it.m_imp.px;
    if (it.m_imp.px != (dir_itr_imp *)0x0) {
      LOCK();
      *(int *)it.m_imp.px = *(int *)it.m_imp.px + 1;
      UNLOCK();
    }
    eod.m_imp.px = (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)
                   (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)local_88;
    if (local_88.m_imp.px != (dir_itr_imp *)0x0) {
      LOCK();
      *(int *)local_88.m_imp.px = *(int *)local_88.m_imp.px + 1;
      UNLOCK();
    }
    local_70 = it.m_imp.px;
    if (it.m_imp.px != (dir_itr_imp *)0x0) {
      LOCK();
      *(int *)it.m_imp.px = *(int *)it.m_imp.px + 1;
      UNLOCK();
    }
    boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
              ((intrusive_ptr<boost::filesystem::detail::dir_itr_imp> *)&fi);
    boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_360);
    local_360 = eod.m_imp.px;
    if (eod.m_imp.px != (dir_itr_imp *)0x0) {
      LOCK();
      *(int *)eod.m_imp.px = *(int *)eod.m_imp.px + 1;
      UNLOCK();
    }
    local_40 = (directory_iterator)(directory_iterator)eod.m_imp.px;
    if (eod.m_imp.px != (dir_itr_imp *)0x0) {
      LOCK();
      *(int *)eod.m_imp.px = *(int *)eod.m_imp.px + 1;
      UNLOCK();
    }
    boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_360);
    local_360.px = local_70.px;
    if (local_70.px != (dir_itr_imp *)0x0) {
      LOCK();
      *(int *)local_70.px = *(int *)local_70.px + 1;
      UNLOCK();
    }
    local_68.px = local_70.px;
    if (local_70.px != (dir_itr_imp *)0x0) {
      LOCK();
      *(int *)local_70.px = *(int *)local_70.px + 1;
      UNLOCK();
    }
    boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_360);
    while ((local_40.m_imp.px != (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)local_68.px
           && (((local_40.m_imp.px != (dir_itr_imp *)0x0 &&
                (*(long *)((long)local_40.m_imp.px + 0x38) != 0)) ||
               ((local_68.px != (dir_itr_imp *)0x0 && (*(long *)(local_68.px + 0x38) != 0))))))) {
      peVar6 = (error_code *)boost::filesystem::directory_iterator::dereference(&local_40);
      boost::filesystem::detail::status((path *)&local_360,peVar6);
      if ((int)local_360.px == 2) {
        boost::filesystem::path::extension();
        iVar5 = boost::filesystem::path::compare((path *)&local_360,"swp");
        if (local_360.px != local_350) {
          operator_delete(local_360.px);
        }
        if (iVar5 != 0) {
          std::ifstream::ifstream((istream *)&local_360,(string *)peVar6,_S_in);
          line.field_2._12_4_ = *(uint *)((long)auStack_340 + *(long *)(local_360.px + -0x18));
          if ((line.field_2._12_4_ & 5) == 0) {
            line._M_dataplus._M_p = (pointer)0x0;
            line._M_string_length._0_1_ = 0;
            result._M_t._M_impl._0_4_ = 0;
            result._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            result._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
            result._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
            result._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&result;
            result._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&result;
            local_b0 = (undefined1  [8])&line._M_string_length;
            while( true ) {
              cVar4 = std::ios::widen((char)*(undefined8 *)(local_360.px + -0x18) +
                                      (char)(istream *)&local_360);
              piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                 ((istream *)&local_360,(string *)local_b0,cVar4);
              if ((((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) ||
                 (line._M_dataplus._M_p == (pointer)0x0)) break;
              iVar9 = std::
                      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                              *)local_158,(key_type *)local_b0);
              if (iVar9.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                  ._M_cur != (__node_type *)0x0) {
                local_60._0_4_ =
                     *(uint *)((long)iVar9.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                                     ._M_cur + 0x28) % local_34;
                pmVar10 = std::
                          map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                          ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                        *)&dict._M_h._M_single_bucket,(key_type *)local_60);
                *pmVar10 = *pmVar10 + 1;
              }
            }
            if (local_34 != 0) {
              uVar15 = 0;
              p_Var11 = (_Base_ptr)&result;
              p_Var14 = (_Base_ptr)result._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
              do {
                for (; p_Var14 != (_Base_ptr)0x0;
                    p_Var14 = (&p_Var14->_M_left)[p_Var14[1]._M_color < uVar15]) {
                  if (p_Var14[1]._M_color >= uVar15) {
                    p_Var11 = p_Var14;
                  }
                }
                p_Var14 = (_Base_ptr)&result;
                if ((p_Var11 != (_Base_ptr)&result) &&
                   (p_Var14 = p_Var11, uVar15 < p_Var11[1]._M_color)) {
                  p_Var14 = (_Base_ptr)&result;
                }
                if (p_Var14 == (_Base_ptr)&result) {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_560,"0,",2);
                }
                else {
                  __val = *(uint *)&p_Var14[1].field_0x4;
                  cVar4 = '\x01';
                  if (9 < __val) {
                    uVar13 = __val;
                    cVar2 = '\x04';
                    do {
                      cVar4 = cVar2;
                      if (uVar13 < 100) {
                        cVar4 = cVar4 + -2;
                        goto LAB_0010d301;
                      }
                      if (uVar13 < 1000) {
                        cVar4 = cVar4 + -1;
                        goto LAB_0010d301;
                      }
                      if (uVar13 < 10000) goto LAB_0010d301;
                      bVar3 = 99999 < uVar13;
                      uVar13 = uVar13 / 10000;
                      cVar2 = cVar4 + '\x04';
                    } while (bVar3);
                    cVar4 = cVar4 + '\x01';
                  }
LAB_0010d301:
                  local_60 = (undefined1  [8])local_50;
                  std::__cxx11::string::_M_construct((ulong)local_60,cVar4);
                  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_60,key,__val);
                  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)&local_560,(char *)local_60,CONCAT44(uStack_54,key)
                                     );
                  std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
                  if (local_60 != (undefined1  [8])local_50) {
                    operator_delete((void *)local_60);
                  }
                }
                uVar15 = uVar15 + 1;
                p_Var11 = (_Base_ptr)&result;
                p_Var14 = (_Base_ptr)result._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
              } while (uVar15 != local_34);
            }
            boost::filesystem::path::filename();
            local_60 = (undefined1  [8])local_50;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_60,targetDir.m_pathname.field_2._8_8_,
                       local_c8 + targetDir.m_pathname.field_2._8_8_);
            pbVar12 = boost::io::detail::
                      quoted_out<char,std::char_traits<char>,std::__cxx11::string_const>
                                ((basic_ostream<char,_std::char_traits<char>_> *)&local_560,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_60,'&','\"');
            if (local_60 != (undefined1  [8])local_50) {
              operator_delete((void *)local_60);
            }
            std::ios::widen((char)*(undefined8 *)(*(long *)pbVar12 + -0x18) + (char)pbVar12);
            std::ostream::put((char)pbVar12);
            std::ostream::flush();
            if ((undefined1 *)targetDir.m_pathname.field_2._8_8_ != local_c0) {
              operator_delete((void *)targetDir.m_pathname.field_2._8_8_);
            }
            std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
            ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                         *)&dict._M_h._M_single_bucket);
            if (local_b0 != (undefined1  [8])&line._M_string_length) {
              operator_delete((void *)local_b0);
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"File ",5);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,*(char **)peVar6,(long)peVar6->cat_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"doesn\'t exist",0xd);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
          }
          std::ifstream::~ifstream((istream *)&local_360);
          if ((line.field_2._12_4_ & 5) != 0) {
            boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_68);
            boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr
                      (&local_40.m_imp);
            bVar3 = false;
            goto LAB_0010d470;
          }
        }
      }
      boost::filesystem::detail::directory_iterator_increment(&local_40,(error_code *)0x0);
    }
    boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_68);
    boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_40.m_imp);
    bVar3 = true;
LAB_0010d470:
    boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_70);
    boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&eod.m_imp);
    local_560 = _VTT;
    *(undefined8 *)((long)&local_560 + *(long *)(_VTT + -0x18)) = _sentry;
    std::filebuf::~filebuf((filebuf *)&of);
    std::ios_base::~ios_base(local_468);
    boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&it.m_imp);
    boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_88.m_imp);
    if ((size_type *)result._M_t._M_impl.super__Rb_tree_header._M_node_count !=
        &targetDir.m_pathname._M_string_length) {
      operator_delete((void *)result._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
  }
  else {
    bVar3 = false;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_158);
  return bVar3;
}

Assistant:

bool prepareData(const std::string& dir_name, const std::string& data_filename, const std::string& dict_filename, const uint32_t num_dimensions)
    {
        std::unordered_map<std::string, uint32_t> dict;
        if (!readDictionary(dict_filename, dict))
            return false;
        
        fs::path targetDir(dir_name); 
        fs::directory_iterator it(targetDir), eod;

        std::ofstream of(data_filename);
        BOOST_FOREACH(const fs::path &p, std::make_pair(it, eod))   
        { 
            if(is_regular_file(p))
            {
                if (p.extension() == "swp")
                    continue;
                std::ifstream fi(p.string());
                if (not fi)
                {
                    std::cerr << "File " << p.string() << "doesn't exist" << std::endl;
                    return false;
                }

                std::string line;
                std::map<uint32_t, uint32_t> result;
                std::hash<uint32_t> uint32_hash;
                while (std::getline(fi, line) and !line.empty())
                {
                    const std::unordered_map<std::string, uint32_t>::const_iterator it = dict.find(line);
                    if (it == dict.end())
                        continue;
                    
                    uint32_t key = uint32_hash(it->second) % num_dimensions;
                    result[key]++;
                }
                
                for (uint32_t i = 0; i < num_dimensions; i++)
                {
                    const std::map<uint32_t, uint32_t>::const_iterator it = result.find(i);
                    if (it == result.end())
                        of << "0,";
                    else
                        of << std::to_string(it->second) << ",";    
                }
                of << p.filename() << std::endl;
            } 
        }
        return true;
    }